

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file.c
# Opt level: O0

_Bool al_fseek(ALLEGRO_FILE *f,int64_t offset,int whence)

{
  byte bVar1;
  int in_EDX;
  long in_RSI;
  long *in_RDI;
  long local_10;
  
  local_10 = in_RSI;
  if ((int)in_RDI[4] != 0) {
    if (in_EDX == 1) {
      local_10 = in_RSI - (int)in_RDI[4];
    }
    *(undefined4 *)(in_RDI + 4) = 0;
  }
  bVar1 = (**(code **)(*in_RDI + 0x30))(in_RDI,local_10,in_EDX);
  return (_Bool)(bVar1 & 1);
}

Assistant:

bool al_fseek(ALLEGRO_FILE *f, int64_t offset, int whence)
{
   ASSERT(f);
   /* offset can be negative */
   ASSERT(
      whence == ALLEGRO_SEEK_SET ||
      whence == ALLEGRO_SEEK_CUR ||
      whence == ALLEGRO_SEEK_END
   );

   if (f->ungetc_len) {
      if (whence == ALLEGRO_SEEK_CUR) {
         offset -= f->ungetc_len;
      }
      f->ungetc_len = 0;
   }

   return f->vtable->fi_fseek(f, offset, whence);
}